

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O0

int __thiscall luna::Lexer::LexId(Lexer *this,TokenDetail *detail)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  String *pSVar4;
  undefined8 *in_RSI;
  string *in_RDI;
  LexException *unaff_retaddr;
  int token;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  undefined1 uVar5;
  string *in_stack_ffffffffffffffc8;
  State *in_stack_ffffffffffffffd0;
  int local_20;
  char (*in_stack_ffffffffffffffe8) [19];
  string *module;
  
  module = in_RDI;
  iVar2 = isalpha(*(int *)(in_RDI + 0x30));
  if ((iVar2 == 0) && (*(int *)(in_RDI + 0x30) != 0x5f)) {
    uVar3 = __cxa_allocate_exception(0x20);
    String::GetCStr(*(String **)(in_RDI + 8));
    LexException::LexException<char_const(&)[19]>
              (unaff_retaddr,(char *)module,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
               in_stack_ffffffffffffffe8);
    __cxa_throw(uVar3,&LexException::typeinfo,LexException::~LexException);
  }
  std::__cxx11::string::clear();
  std::__cxx11::string::push_back((char)in_RDI + '@');
  iVar2 = Next((Lexer *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  *(int *)(in_RDI + 0x30) = iVar2;
  while( true ) {
    iVar2 = isalnum(*(int *)(in_RDI + 0x30));
    uVar5 = true;
    if (iVar2 == 0) {
      uVar5 = *(int *)(in_RDI + 0x30) == 0x5f;
    }
    if ((bool)uVar5 == false) break;
    std::__cxx11::string::push_back((char)in_RDI + '@');
    iVar2 = Next((Lexer *)CONCAT17(uVar5,in_stack_ffffffffffffffc0));
    *(int *)(in_RDI + 0x30) = iVar2;
  }
  local_20 = 0;
  bVar1 = anon_unknown.dwarf_aead8::IsKeyWord(in_RDI,(int *)in_stack_ffffffffffffffd0);
  if (!bVar1) {
    local_20 = 0x115;
  }
  pSVar4 = State::GetString(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  *in_RSI = pSVar4;
  *(int *)(in_RSI + 3) = local_20;
  *(undefined4 *)(in_RSI + 2) = *(undefined4 *)(in_RDI + 0x34);
  *(undefined4 *)((long)in_RSI + 0x14) = *(undefined4 *)(in_RDI + 0x38);
  in_RSI[1] = *(undefined8 *)(in_RDI + 8);
  return local_20;
}

Assistant:

int Lexer::LexId(TokenDetail *detail)
    {
        if (!isalpha(current_) && current_ != '_')
            throw LexException(module_->GetCStr(),
                    line_, column_, "unexpect character");

        token_buffer_.clear();
        token_buffer_.push_back(current_);
        current_ = Next();

        while (isalnum(current_) || current_ == '_')
        {
            token_buffer_.push_back(current_);
            current_ = Next();
        }

        int token = 0;
        if (!IsKeyWord(token_buffer_, &token))
            token = Token_Id;
        RETURN_TOKEN_DETAIL(detail, token_buffer_, token);
    }